

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O1

bool CoreML::Specification::operator==(GLMRegressor *a,GLMRegressor *b)

{
  bool bVar1;
  
  bVar1 = operator==(&a->weights_,&b->weights_);
  if ((bVar1) && (bVar1 = operator==(&a->offset_,&b->offset_), bVar1)) {
    return a->postevaluationtransform_ == b->postevaluationtransform_;
  }
  return false;
}

Assistant:

bool operator==(const GLMRegressor& a,
                        const GLMRegressor& b) {
            if (a.weights() != b.weights()) {
                return false;
            }
            if (a.offset() != b.offset()) {
                return false;
            }
            if (a.postevaluationtransform() != b.postevaluationtransform()) {
                return false;
            }
            return true;
        }